

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray *
QtStringBuilder::appendToByteArray<QStringBuilder<char_const*&,QByteArray>,QByteArray>
          (QByteArray *a,QStringBuilder<QStringBuilder<const_char_*&,_QByteArray>,_QByteArray> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  char cVar2;
  size_t __n;
  size_t sVar3;
  Data *pDVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long alloc;
  long lVar8;
  char *__dest;
  long size;
  
  lVar6 = (a->d).size;
  pcVar5 = *(b->a).a;
  if (pcVar5 == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(pcVar5);
  }
  size = sVar3 + lVar6 + (b->a).b.d.size + (b->b).d.size;
  pDVar4 = (a->d).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData(a,lVar6,KeepSize);
    pDVar4 = (a->d).d;
    if (pDVar4 != (Data *)0x0) goto LAB_002bb049;
    if (0 < size) {
      lVar6 = (a->d).size;
      alloc = size;
      goto LAB_002bb098;
    }
  }
  else {
LAB_002bb049:
    lVar7 = (pDVar4->super_QArrayData).alloc;
    pcVar5 = (a->d).ptr;
    lVar6 = (a->d).size;
    lVar8 = ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar7;
    if ((lVar8 - lVar6) - (long)pcVar5 < size) {
      alloc = lVar7 * 2;
      if (lVar7 * 2 < size) {
        alloc = size;
      }
      if ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar8 - (long)pcVar5 < alloc)) {
LAB_002bb098:
        if (alloc < lVar6) {
          alloc = lVar6;
        }
        QByteArray::reallocData(a,alloc,KeepSize);
        pDVar4 = (a->d).d;
        if (pDVar4 == (Data *)0x0) goto LAB_002bb0c8;
        lVar7 = (pDVar4->super_QArrayData).alloc;
      }
      if (lVar7 != 0) {
        pAVar1 = &(pDVar4->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_002bb0d9;
  }
LAB_002bb0c8:
  QByteArray::reallocData(a,(a->d).size,KeepSize);
LAB_002bb0d9:
  __dest = (a->d).ptr + (a->d).size;
  pcVar5 = *(b->a).a;
  if (pcVar5 != (char *)0x0) {
    cVar2 = *pcVar5;
    while (cVar2 != '\0') {
      pcVar5 = pcVar5 + 1;
      *__dest = cVar2;
      __dest = __dest + 1;
      cVar2 = *pcVar5;
    }
  }
  sVar3 = (b->a).b.d.size;
  if (sVar3 != 0) {
    memcpy(__dest,(b->a).b.d.ptr,sVar3);
  }
  __n = (b->b).d.size;
  if (__n != 0) {
    memcpy(__dest + sVar3,(b->b).d.ptr,__n);
  }
  QByteArray::resize(a,size);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}